

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

bool __thiscall FSliderItem::MouseEvent(FSliderItem *this,int type,int x,int y)

{
  DMenu *pDVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  FSoundID local_24;
  
  pDVar1 = DMenu::CurrentMenu;
  if (type != 0) {
    if (DMenu::CurrentMenu[1].super_DObject.Class != (PClass *)this) {
      return false;
    }
    if (type == 2) {
      DMenu::CurrentMenu[1].super_DObject.Class = (PClass *)0x0;
    }
  }
  iVar2 = FFont::StringWidth(SmallFont,(BYTE *)"Green");
  iVar4 = (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos;
  iVar5 = iVar2 + iVar4 + 8;
  iVar4 = iVar4 + iVar2 + 0x68;
  if ((type != 0) || (x < iVar4 && iVar5 <= x)) {
    if (x < iVar4) {
      iVar4 = x;
    }
    iVar2 = 0;
    if (iVar5 < x) {
      iVar2 = iVar4 - iVar5;
    }
    lVar3 = (long)iVar2 * ((long)this->mMaxrange - (long)this->mMinrange);
    iVar4 = ((int)((ulong)(lVar3 / 6 + (lVar3 >> 0x3f)) >> 4) -
            (SUB164(SEXT816(lVar3) * SEXT816(0x2aaaaaaaaaaaaaab),0xc) >> 0x1f)) + this->mMinrange;
    if (iVar4 != this->mSelection) {
      this->mSelection = iVar4;
      S_FindSound("menu/change");
      S_Sound(0x22,&local_24,snd_menuvolume.Value,0.0);
    }
    if (type == 0) {
      pDVar1[1].super_DObject.Class = (PClass *)this;
    }
  }
  return true;
}

Assistant:

bool FSliderItem::MouseEvent(int type, int x, int y)
{
	DListMenu *lm = static_cast<DListMenu*>(DMenu::CurrentMenu);
	if (type != DMenu::MOUSE_Click)
	{
		if (!lm->CheckFocus(this)) return false;
	}
	if (type == DMenu::MOUSE_Release)
	{
		lm->ReleaseFocus();
	}

	int slide_left = SmallFont->StringWidth ("Green") + 8 + mXpos;
	int slide_right = slide_left + 12*8;	// 12 char cells with 8 pixels each.

	if (type == DMenu::MOUSE_Click)
	{
		if (x < slide_left || x >= slide_right) return true;
	}

	x = clamp(x, slide_left, slide_right);
	int v = mMinrange + Scale(x - slide_left, mMaxrange - mMinrange, slide_right - slide_left);
	if (v != mSelection)
	{
		mSelection = v;
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
	}
	if (type == DMenu::MOUSE_Click)
	{
		lm->SetFocus(this);
	}
	return true;
}